

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::btToPos(SAT *this,int sat_pos,int core_pos)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int pos;
  
  vec<vec<Lit>_>::last((vec<vec<Lit>_> *)(in_RDI + 0xc0));
  pos = (int)((ulong)in_RDI >> 0x20);
  untrailToPos(this,(vec<Lit> *)CONCAT44(sat_pos,core_pos),unaff_retaddr);
  Engine::btToPos((Engine *)CONCAT44(in_ESI,in_EDX),pos);
  return;
}

Assistant:

void SAT::btToPos(int sat_pos, int core_pos) {
	untrailToPos(trail.last(), sat_pos);
	engine.btToPos(core_pos);
}